

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.hpp
# Opt level: O3

void __thiscall
ableton::link::
Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
::Impl::gatewayClosed(Impl *this,address *gatewayAddr)

{
  __normal_iterator<std::pair<ableton::link::PeerState,_asio::ip::address>_*,_std::vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>_>
  __first;
  
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::pair<ableton::link::PeerState,asio::ip::address>*,std::vector<std::pair<ableton::link::PeerState,asio::ip::address>,std::allocator<std::pair<ableton::link::PeerState,asio::ip::address>>>>,__gnu_cxx::__ops::_Iter_pred<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>::Impl::gatewayClosed(asio::ip::address_const&)::_lambda(std::pair<ableton::link::PeerState,asio::ip::address>const&)_1_>>
                      ((this->mPeers).
                       super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->mPeers).
                       super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_tidalcycles[P]TidaLink_link_include_ableton_link_Peers_hpp:293:13)>
                        )gatewayAddr);
  std::
  vector<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
  ::_M_erase(&this->mPeers,(iterator)__first._M_current,
             (this->mPeers).
             super__Vector_base<std::pair<ableton::link::PeerState,_asio::ip::address>,_std::allocator<std::pair<ableton::link::PeerState,_asio::ip::address>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::SessionPeerCounter::operator()((this->mSessionMembershipCallback)._M_data);
  return;
}

Assistant:

void gatewayClosed(const asio::ip::address& gatewayAddr)
    {
      using namespace std;

      {
        mPeers.erase(
          remove_if(begin(mPeers), end(mPeers),
            [&gatewayAddr](const Peer& peer) { return peer.second == gatewayAddr; }),
          end(mPeers));
      } // end lock

      mSessionMembershipCallback();
    }